

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-reduce.cpp
# Opt level: O0

void __thiscall Reducer::applyTestToWorking(Reducer *this)

{
  size_t __val;
  string local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  string local_80 [48];
  string local_50 [32];
  string local_30 [32];
  Reducer *local_10;
  Reducer *this_local;
  
  local_10 = this;
  std::__cxx11::string::string(local_30,(string *)&this->test);
  std::__cxx11::string::string(local_50,(string *)&this->working);
  wasm::copy_file(local_30,local_50);
  std::__cxx11::string::~string(local_50);
  std::__cxx11::string::~string(local_30);
  if ((saveAllWorkingFiles & 1U) != 0) {
    std::__cxx11::string::string(local_80,(string *)&this->working);
    std::operator+(&local_c0,&this->working,'.');
    __val = workingFileIndex;
    workingFileIndex = workingFileIndex + 1;
    std::__cxx11::to_string(&local_e0,__val);
    std::operator+(&local_a0,&local_c0,&local_e0);
    wasm::copy_file(local_80,&local_a0);
    std::__cxx11::string::~string((string *)&local_a0);
    std::__cxx11::string::~string((string *)&local_e0);
    std::__cxx11::string::~string((string *)&local_c0);
    std::__cxx11::string::~string(local_80);
  }
  return;
}

Assistant:

void applyTestToWorking() {
    copy_file(test, working);

    if (saveAllWorkingFiles) {
      copy_file(working, working + '.' + std::to_string(workingFileIndex++));
    }
  }